

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall
QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl
          (ConnectionData *this,QObject *sender,LockPolicy lockPolicy)

{
  TaggedSignalVector o;
  QBasicMutex *this_00;
  long in_FS_OFFSET;
  unique_lock<QBasicMutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBasicMutex *)
            ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
            (ulong)((uint)(((ulong)sender & 0xffffffff) % 0x418) & 0x7f8));
  local_38._M_owns = false;
  local_38._9_7_ = 0xaaaaaaaaaaaaaa;
  local_38._M_device = this_00;
  if (lockPolicy == NeedToLock) {
    std::unique_lock<QBasicMutex>::lock(&local_38);
  }
  if ((this->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i < 2) {
    LOCK();
    o.c = (this->orphaned)._M_i.c;
    (this->orphaned)._M_i.c = 0;
    UNLOCK();
    std::unique_lock<QBasicMutex>::~unique_lock(&local_38);
    if (o.c != 0) {
      if (lockPolicy == AlreadyLockedAndTemporarilyReleasingLock) {
        QBasicMutex::unlock(this_00);
        deleteOrphaned(o);
        QBasicMutex::lock(this_00);
      }
      else {
        deleteOrphaned(o);
      }
    }
  }
  else {
    std::unique_lock<QBasicMutex>::~unique_lock(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl(QObject *sender, LockPolicy lockPolicy)
{
    QBasicMutex *senderMutex = signalSlotLock(sender);
    TaggedSignalVector c = nullptr;
    {
        std::unique_lock<QBasicMutex> lock(*senderMutex, std::defer_lock_t{});
        if (lockPolicy == NeedToLock)
            lock.lock();
        if (ref.loadAcquire() > 1)
            return;

        // Since ref == 1, no activate() is in process since we locked the mutex. That implies,
        // that nothing can reference the orphaned connection objects anymore and they can
        // be safely deleted
        c = orphaned.exchange(nullptr, std::memory_order_relaxed);
    }
    if (c) {
        // Deleting c might run arbitrary user code, so we must not hold the lock
        if (lockPolicy == AlreadyLockedAndTemporarilyReleasingLock) {
            senderMutex->unlock();
            deleteOrphaned(c);
            senderMutex->lock();
        } else {
            deleteOrphaned(c);
        }
    }
}